

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O1

Abc_Ntk_t * Acb_NtkToAbc(Abc_Ntk_t *pNtk,Acb_Ntk_t *p)

{
  int iVar1;
  Mem_Flex_t *pMan;
  Vec_Ptr_t *pVVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  Vec_Int_t *vCover;
  int *piVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 1000;
  vCover->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vCover->pArray = piVar6;
  uVar4 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar4) {
    piVar6 = (p->vObjCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar4 << 2);
    }
    (p->vObjCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar4 * 4);
  }
  (p->vObjCopy).nSize = uVar4;
  if (0 < (p->vCis).nSize) {
    piVar6 = (p->vCis).pArray;
    pVVar2 = pNtk_00->vCis;
    lVar11 = 0;
    do {
      if (pVVar2->nSize <= lVar11) goto LAB_0038dfdb;
      uVar4 = piVar6[lVar11];
      if ((int)uVar4 < 1) goto LAB_0038e041;
      iVar5 = (p->vObjCopy).nSize;
      if (iVar5 < 1) goto LAB_0038e038;
      if (iVar5 <= (int)uVar4) goto LAB_0038dffa;
      piVar3 = (p->vObjCopy).pArray;
      if (piVar3[uVar4] != -1) goto LAB_0038e07f;
      piVar3[uVar4] = *(int *)((long)pVVar2->pArray[lVar11] + 0x10);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCis).nSize);
  }
  if (1 < (p->vObjType).nSize) {
    uVar12 = 1;
    lVar11 = 8;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar12) goto LAB_0038e060;
      uVar4 = (uint)(byte)(p->vObjType).pArray[uVar12];
      if ((4 < uVar4) || ((0x19U >> (uVar4 & 0x1f) & 1) == 0)) {
        pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        if ((long)(p->vObjFans).nSize <= (long)uVar12) goto LAB_0038dffa;
        iVar5 = (p->vObjFans).pArray[uVar12];
        if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) goto LAB_0038e019;
        uVar10 = (ulong)(p->vObjTruth).nSize;
        if ((long)uVar10 < 1) {
          __assert_fail("Acb_NtkHasObjTruths(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10c,"word *Acb_ObjTruthP(Acb_Ntk_t *, int)");
        }
        if (uVar10 <= uVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pcVar8 = Abc_SopCreateFromTruthIsop
                           (pMan,(p->vFanSto).pArray[iVar5],
                            (word *)((long)(p->vObjTruth).pArray + lVar11),vCover);
        (pAVar7->field_5).pData = pcVar8;
        uVar10 = (ulong)(p->vObjCopy).nSize;
        if ((long)uVar10 < 1) goto LAB_0038e038;
        if (uVar10 <= uVar12) goto LAB_0038dffa;
        piVar6 = (p->vObjCopy).pArray;
        if (piVar6[uVar12] != -1) {
LAB_0038e07f:
          __assert_fail("Acb_ObjCopy(p, i) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
        }
        piVar6[uVar12] = pAVar7->Id;
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 8;
    } while ((long)uVar12 < (long)(p->vObjType).nSize);
  }
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  if (1 < (p->vObjType).nSize) {
    uVar12 = 1;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar12) {
LAB_0038e060:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar4 = (uint)(byte)(p->vObjType).pArray[uVar12];
      if ((4 < uVar4) || ((0x19U >> (uVar4 & 0x1f) & 1) == 0)) {
        uVar10 = (ulong)(p->vObjCopy).nSize;
        if ((long)uVar10 < 1) goto LAB_0038e038;
        if (uVar10 <= uVar12) goto LAB_0038dffa;
        iVar5 = (p->vObjCopy).pArray[uVar12];
        if (((long)iVar5 < 0) || (pNtk_00->vObjs->nSize <= iVar5)) goto LAB_0038dfdb;
        if ((long)(p->vObjFans).nSize <= (long)uVar12) goto LAB_0038dffa;
        pAVar7 = (Abc_Obj_t *)pNtk_00->vObjs->pArray[iVar5];
        lVar11 = 0;
        while( true ) {
          iVar5 = (p->vObjFans).pArray[uVar12];
          lVar9 = (long)iVar5;
          if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar5)) goto LAB_0038e019;
          piVar6 = (p->vFanSto).pArray;
          if (piVar6[lVar9] <= lVar11) break;
          iVar5 = piVar6[lVar9 + lVar11 + 1];
          if ((long)iVar5 < 1) goto LAB_0038e041;
          iVar1 = (p->vObjCopy).nSize;
          if (iVar1 < 1) goto LAB_0038e038;
          if (iVar1 <= iVar5) goto LAB_0038dffa;
          iVar5 = (p->vObjCopy).pArray[iVar5];
          if (((long)iVar5 < 0) || (pNtk_00->vObjs->nSize <= iVar5)) goto LAB_0038dfdb;
          Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)pNtk_00->vObjs->pArray[iVar5]);
          lVar11 = lVar11 + 1;
          if ((long)(p->vObjFans).nSize <= (long)uVar12) goto LAB_0038dffa;
        }
        iVar5 = Abc_SopGetVarNum((char *)(pAVar7->field_5).pData);
        if (iVar5 != (pAVar7->vFanins).nSize) {
          __assert_fail("Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                        ,0x8c,"Abc_Ntk_t *Acb_NtkToAbc(Abc_Ntk_t *, Acb_Ntk_t *)");
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(p->vObjType).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar11 = 0;
    do {
      iVar5 = (p->vCos).pArray[lVar11];
      if ((long)iVar5 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar5) {
LAB_0038dffa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = (p->vObjFans).pArray[iVar5];
      if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) {
LAB_0038e019:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if (pNtk_00->vCos->nSize <= lVar11) {
LAB_0038dfdb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = (p->vFanSto).pArray[(long)iVar5 + 1];
      if ((int)uVar4 < 1) goto LAB_0038e041;
      iVar5 = (p->vObjCopy).nSize;
      if (iVar5 < 1) goto LAB_0038e038;
      if (iVar5 <= (int)uVar4) goto LAB_0038dffa;
      iVar5 = (p->vObjCopy).pArray[uVar4];
      if (((long)iVar5 < 0) || (pNtk_00->vObjs->nSize <= iVar5)) goto LAB_0038dfdb;
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk_00->vCos->pArray[lVar11],
                      (Abc_Obj_t *)pNtk_00->vObjs->pArray[iVar5]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCos).nSize);
  }
  iVar5 = Abc_NtkCheck(pNtk_00);
  if (iVar5 == 0) {
    puts("Acb_NtkToAbc: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
LAB_0038e041:
  pcVar8 = "i>0";
  goto LAB_0038e048;
LAB_0038e038:
  pcVar8 = "Acb_NtkHasObjCopies(p)";
LAB_0038e048:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Acb_NtkToAbc( Abc_Ntk_t * pNtk, Acb_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Abc_Ntk_t * pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    Mem_Flex_t * pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    Vec_Int_t * vCover = Vec_IntAlloc( 1000 );
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(Abc_NtkCi(pNtkNew, i)) );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkCreateNode( pNtkNew );
        pObjNew->pData = Abc_SopCreateFromTruthIsop( pMan, Acb_ObjFaninNum(p, iObj), Acb_ObjTruthP(p, iObj), vCover );
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(pObjNew) );
    }
    Vec_IntFree( vCover );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iObj));
        Acb_ObjForEachFanin( p, iObj, iFanin, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
        assert( Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew) );
    }
    Acb_NtkForEachCoDriver( p, iFanin, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Acb_NtkToAbc: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}